

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined8 *puVar6;
  undefined4 uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  int iVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar20;
  long lVar21;
  RTCRayN *pRVar22;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar28;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar29;
  ulong uVar30;
  float fVar31;
  float fVar62;
  float fVar63;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar64;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar61;
  float fVar65;
  float fVar79;
  float fVar81;
  float fVar82;
  undefined1 auVar67 [16];
  uint uVar66;
  uint uVar80;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar83;
  float fVar91;
  float fVar92;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar87;
  undefined1 auVar88 [16];
  float fVar93;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar94;
  float fVar95;
  float fVar109;
  float fVar110;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar99;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined8 uVar114;
  float fVar119;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar120;
  undefined1 auVar117 [16];
  float fVar121;
  float fVar127;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar124;
  undefined1 auVar125 [16];
  float fVar128;
  undefined1 auVar126 [16];
  float fVar129;
  float fVar130;
  float fVar135;
  float fVar136;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar137;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar138;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar147;
  float fVar148;
  float fVar155;
  float fVar156;
  float fVar158;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar157;
  float fVar159;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar160 [16];
  float fVar161;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar175;
  float fVar177;
  float fVar180;
  undefined1 auVar173 [16];
  float fVar176;
  float fVar178;
  float fVar179;
  float fVar181;
  float fVar182;
  undefined1 auVar174 [16];
  float fVar183;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined8 local_1398;
  undefined8 uStack_1390;
  vbool<4> valid;
  undefined1 local_1368 [16];
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined1 local_1318 [16];
  RTCFilterFunctionNArguments args;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  vfloat<4> tNear;
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [16];
  undefined1 local_11d8 [8];
  float fStack_11d0;
  float fStack_11cc;
  undefined1 local_11c8 [16];
  undefined1 local_11b8 [16];
  undefined1 local_11a8 [16];
  undefined1 local_1198 [16];
  undefined1 local_1188 [8];
  float fStack_1180;
  float fStack_117c;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  undefined1 local_1168 [8];
  float fStack_1160;
  float fStack_115c;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined1 local_1128 [16];
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined4 local_10d8;
  undefined4 uStack_10d4;
  undefined4 uStack_10d0;
  undefined4 uStack_10cc;
  undefined4 local_10c8;
  undefined4 uStack_10c4;
  undefined4 uStack_10c0;
  undefined4 uStack_10bc;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  uint local_1098;
  uint uStack_1094;
  uint uStack_1090;
  uint uStack_108c;
  uint local_1088;
  uint uStack_1084;
  uint uStack_1080;
  uint uStack_107c;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong uVar23;
  float fVar118;
  
  pSVar28 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar113 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar93 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar82 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar161 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar164 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar165 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar183 = fVar161 * 0.99999964;
  fVar129 = fVar164 * 0.99999964;
  fVar172 = fVar165 * 0.99999964;
  fVar161 = fVar161 * 1.0000004;
  fVar164 = fVar164 * 1.0000004;
  fVar165 = fVar165 * 1.0000004;
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar17 = (tray->tnear).field_0.i[k];
  auVar88._4_4_ = iVar17;
  auVar88._0_4_ = iVar17;
  auVar88._8_4_ = iVar17;
  auVar88._12_4_ = iVar17;
  iVar17 = (tray->tfar).field_0.i[k];
  auVar150._4_4_ = iVar17;
  auVar150._0_4_ = iVar17;
  auVar150._8_4_ = iVar17;
  auVar150._12_4_ = iVar17;
  local_1068 = mm_lookupmask_ps._0_8_;
  uStack_1060 = mm_lookupmask_ps._8_8_;
  local_1078 = mm_lookupmask_ps._240_8_;
  uStack_1070 = mm_lookupmask_ps._248_8_;
  local_fe8 = fVar113;
  fStack_fe4 = fVar113;
  fStack_fe0 = fVar113;
  fStack_fdc = fVar113;
  local_ff8 = fVar93;
  fStack_ff4 = fVar93;
  fStack_ff0 = fVar93;
  fStack_fec = fVar93;
  local_1008 = fVar82;
  fStack_1004 = fVar82;
  fStack_1000 = fVar82;
  fStack_ffc = fVar82;
  local_1018 = fVar161;
  fStack_1014 = fVar161;
  fStack_1010 = fVar161;
  fStack_100c = fVar161;
  local_1028 = fVar164;
  fStack_1024 = fVar164;
  fStack_1020 = fVar164;
  fStack_101c = fVar164;
  local_1038 = fVar165;
  fStack_1034 = fVar165;
  fStack_1030 = fVar165;
  fStack_102c = fVar165;
  local_1048 = fVar172;
  fStack_1044 = fVar172;
  fStack_1040 = fVar172;
  fStack_103c = fVar172;
  local_1058 = fVar183;
  fStack_1054 = fVar183;
  fStack_1050 = fVar183;
  fStack_104c = fVar183;
  local_1118 = fVar129;
  fStack_1114 = fVar129;
  fStack_1110 = fVar129;
  fStack_110c = fVar129;
  local_1128 = auVar88;
  fVar175 = fVar164;
  fVar177 = fVar164;
  fVar180 = fVar164;
  fVar121 = fVar165;
  fVar127 = fVar165;
  fVar128 = fVar165;
  fVar169 = fVar129;
  fVar171 = fVar129;
  fVar148 = fVar129;
  fVar157 = fVar113;
  fVar159 = fVar113;
  fVar31 = fVar113;
  fVar62 = fVar93;
  fVar63 = fVar93;
  fVar64 = fVar93;
  fVar65 = fVar82;
  fVar79 = fVar82;
  fVar81 = fVar82;
  fVar83 = fVar161;
  fVar91 = fVar161;
  fVar92 = fVar161;
  fVar94 = fVar172;
  fVar95 = fVar172;
  fVar109 = fVar172;
  fVar110 = fVar183;
  fVar111 = fVar183;
  fVar112 = fVar183;
LAB_0070e895:
  do {
    do {
      if (pSVar28 == stack) {
        return;
      }
      pSVar20 = pSVar28 + -1;
      pSVar28 = pSVar28 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar20->dist &&
             (float)pSVar20->dist != *(float *)(ray + k * 4 + 0x80));
    pSVar20 = stack;
    pSVar29 = (StackItemT<embree::NodeRefPtr<4>_> *)(pSVar28->ptr).ptr;
    while (((ulong)pSVar29 & 8) == 0) {
      pfVar1 = (float *)((long)&pSVar29[2].ptr.ptr + uVar25);
      auVar32._0_4_ = (*pfVar1 - fVar113) * fVar183;
      auVar32._4_4_ = (pfVar1[1] - fVar157) * fVar110;
      auVar32._8_4_ = (pfVar1[2] - fVar159) * fVar111;
      auVar32._12_4_ = (pfVar1[3] - fVar31) * fVar112;
      pfVar1 = (float *)((long)&pSVar29[2].ptr.ptr + uVar27);
      auVar123._0_4_ = (*pfVar1 - fVar93) * fVar129;
      auVar123._4_4_ = (pfVar1[1] - fVar62) * fVar169;
      auVar123._8_4_ = (pfVar1[2] - fVar63) * fVar171;
      auVar123._12_4_ = (pfVar1[3] - fVar64) * fVar148;
      auVar32 = maxps(auVar32,auVar123);
      pfVar1 = (float *)((long)&pSVar29[2].ptr.ptr + uVar24);
      auVar132._0_4_ = (*pfVar1 - fVar82) * fVar172;
      auVar132._4_4_ = (pfVar1[1] - fVar65) * fVar94;
      auVar132._8_4_ = (pfVar1[2] - fVar79) * fVar95;
      auVar132._12_4_ = (pfVar1[3] - fVar81) * fVar109;
      auVar84 = maxps(auVar132,auVar88);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar32,auVar84);
      pfVar1 = (float *)((long)&pSVar29[2].ptr.ptr + (uVar25 ^ 0x10));
      auVar85._0_4_ = (*pfVar1 - fVar113) * fVar161;
      auVar85._4_4_ = (pfVar1[1] - fVar157) * fVar83;
      auVar85._8_4_ = (pfVar1[2] - fVar159) * fVar91;
      auVar85._12_4_ = (pfVar1[3] - fVar31) * fVar92;
      pfVar1 = (float *)((long)&pSVar29[2].ptr.ptr + (uVar27 ^ 0x10));
      auVar96._0_4_ = (*pfVar1 - fVar93) * fVar164;
      auVar96._4_4_ = (pfVar1[1] - fVar62) * fVar175;
      auVar96._8_4_ = (pfVar1[2] - fVar63) * fVar177;
      auVar96._12_4_ = (pfVar1[3] - fVar64) * fVar180;
      auVar32 = minps(auVar85,auVar96);
      pfVar1 = (float *)((long)&pSVar29[2].ptr.ptr + (uVar24 ^ 0x10));
      auVar97._0_4_ = (*pfVar1 - fVar82) * fVar165;
      auVar97._4_4_ = (pfVar1[1] - fVar65) * fVar121;
      auVar97._8_4_ = (pfVar1[2] - fVar79) * fVar127;
      auVar97._12_4_ = (pfVar1[3] - fVar81) * fVar128;
      auVar84 = minps(auVar97,auVar150);
      auVar32 = minps(auVar32,auVar84);
      auVar84._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar32._4_4_);
      auVar84._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar32._0_4_);
      auVar84._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar32._8_4_);
      auVar84._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar32._12_4_);
      uVar16 = movmskps((int)pSVar20,auVar84);
      if (uVar16 == 0) goto LAB_0070e895;
      uVar16 = uVar16 & 0xff;
      uVar30 = (ulong)pSVar29 & 0xfffffffffffffff0;
      lVar26 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
        }
      }
      pSVar20 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar30 + lVar26 * 8);
      uVar16 = uVar16 - 1 & uVar16;
      pSVar29 = pSVar20;
      if (uVar16 != 0) {
        uVar66 = tNear.field_0.i[lVar26];
        lVar26 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
          }
        }
        pSVar29 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar30 + lVar26 * 8);
        uVar80 = tNear.field_0.i[lVar26];
        uVar16 = uVar16 - 1 & uVar16;
        if (uVar16 == 0) {
          if (uVar66 < uVar80) {
            (pSVar28->ptr).ptr = (size_t)pSVar29;
            pSVar28->dist = uVar80;
            pSVar28 = pSVar28 + 1;
            pSVar29 = pSVar20;
          }
          else {
            (pSVar28->ptr).ptr = (size_t)pSVar20;
            pSVar28->dist = uVar66;
            pSVar20 = pSVar29;
            pSVar28 = pSVar28 + 1;
          }
        }
        else {
          auVar86._8_4_ = uVar66;
          auVar86._0_8_ = pSVar20;
          auVar86._12_4_ = 0;
          auVar115._8_4_ = uVar80;
          auVar115._0_8_ = pSVar29;
          auVar115._12_4_ = 0;
          lVar26 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
            }
          }
          uVar114 = *(undefined8 *)(uVar30 + lVar26 * 8);
          iVar17 = tNear.field_0.i[lVar26];
          auVar98._8_4_ = iVar17;
          auVar98._0_8_ = uVar114;
          auVar98._12_4_ = 0;
          auVar33._8_4_ = -(uint)((int)uVar66 < (int)uVar80);
          uVar16 = uVar16 - 1 & uVar16;
          if (uVar16 == 0) {
            auVar33._4_4_ = auVar33._8_4_;
            auVar33._0_4_ = auVar33._8_4_;
            auVar33._12_4_ = auVar33._8_4_;
            auVar122._8_4_ = uVar80;
            auVar122._0_8_ = pSVar29;
            auVar122._12_4_ = 0;
            auVar123 = blendvps(auVar122,auVar86,auVar33);
            auVar32 = blendvps(auVar86,auVar115,auVar33);
            auVar34._8_4_ = -(uint)(auVar123._8_4_ < iVar17);
            auVar34._4_4_ = auVar34._8_4_;
            auVar34._0_4_ = auVar34._8_4_;
            auVar34._12_4_ = auVar34._8_4_;
            auVar116._8_4_ = iVar17;
            auVar116._0_8_ = uVar114;
            auVar116._12_4_ = 0;
            auVar84 = blendvps(auVar116,auVar123,auVar34);
            auVar123 = blendvps(auVar123,auVar98,auVar34);
            auVar35._8_4_ = -(uint)(auVar32._8_4_ < auVar123._8_4_);
            auVar35._4_4_ = auVar35._8_4_;
            auVar35._0_4_ = auVar35._8_4_;
            auVar35._12_4_ = auVar35._8_4_;
            SVar99 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar123,auVar32,auVar35);
            SVar87 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar32,auVar123,auVar35);
            *pSVar28 = SVar87;
            pSVar28[1] = SVar99;
            pSVar20 = auVar84._0_8_;
            pSVar28 = pSVar28 + 2;
            pSVar29 = pSVar20;
          }
          else {
            lVar26 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
              }
            }
            auVar36._4_4_ = auVar33._8_4_;
            auVar36._0_4_ = auVar33._8_4_;
            auVar36._8_4_ = auVar33._8_4_;
            auVar36._12_4_ = auVar33._8_4_;
            auVar123 = blendvps(auVar115,auVar86,auVar36);
            auVar88 = blendvps(auVar86,auVar115,auVar36);
            auVar131._8_4_ = tNear.field_0.i[lVar26];
            auVar131._0_8_ = *(undefined8 *)(uVar30 + lVar26 * 8);
            auVar131._12_4_ = 0;
            auVar37._8_4_ = -(uint)(iVar17 < tNear.field_0.i[lVar26]);
            auVar37._4_4_ = auVar37._8_4_;
            auVar37._0_4_ = auVar37._8_4_;
            auVar37._12_4_ = auVar37._8_4_;
            auVar84 = blendvps(auVar131,auVar98,auVar37);
            auVar32 = blendvps(auVar98,auVar131,auVar37);
            auVar38._8_4_ = -(uint)(auVar88._8_4_ < auVar32._8_4_);
            auVar38._4_4_ = auVar38._8_4_;
            auVar38._0_4_ = auVar38._8_4_;
            auVar38._12_4_ = auVar38._8_4_;
            auVar132 = blendvps(auVar32,auVar88,auVar38);
            SVar87 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar88,auVar32,auVar38);
            auVar39._8_4_ = -(uint)(auVar123._8_4_ < auVar84._8_4_);
            auVar39._4_4_ = auVar39._8_4_;
            auVar39._0_4_ = auVar39._8_4_;
            auVar39._12_4_ = auVar39._8_4_;
            auVar88 = blendvps(auVar84,auVar123,auVar39);
            auVar32 = blendvps(auVar123,auVar84,auVar39);
            auVar40._8_4_ = -(uint)(auVar32._8_4_ < auVar132._8_4_);
            auVar40._4_4_ = auVar40._8_4_;
            auVar40._0_4_ = auVar40._8_4_;
            auVar40._12_4_ = auVar40._8_4_;
            SVar99 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar132,auVar32,auVar40);
            SVar124 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar32,auVar132,auVar40);
            *pSVar28 = SVar87;
            pSVar28[1] = SVar124;
            pSVar28[2] = SVar99;
            pSVar20 = auVar88._0_8_;
            pSVar28 = pSVar28 + 3;
            pSVar29 = pSVar20;
            auVar88 = local_1128;
            fVar129 = local_1118;
            fVar169 = fStack_1114;
            fVar171 = fStack_1110;
            fVar148 = fStack_110c;
          }
        }
      }
    }
    uVar30 = (ulong)pSVar29 & 0xfffffffffffffff0;
    for (lVar26 = 0; lVar26 != (ulong)((uint)pSVar29 & 0xf) - 8; lVar26 = lVar26 + 1) {
      lVar21 = lVar26 * 0xe0;
      puVar6 = (undefined8 *)(uVar30 + 0xd0 + lVar21);
      local_1278 = *puVar6;
      uStack_1270 = puVar6[1];
      fVar113 = *(float *)(ray + k * 4);
      fVar93 = *(float *)(ray + k * 4 + 0x10);
      fVar82 = *(float *)(ray + k * 4 + 0x20);
      pfVar1 = (float *)(uVar30 + lVar21);
      pfVar3 = (float *)(uVar30 + 0x10 + lVar21);
      pfVar4 = (float *)(uVar30 + 0x20 + lVar21);
      pfVar5 = (float *)(uVar30 + 0x30 + lVar21);
      fVar175 = *pfVar5;
      fVar177 = pfVar5[1];
      fVar180 = pfVar5[2];
      fVar121 = pfVar5[3];
      local_1138 = *pfVar1 - fVar113;
      fStack_1134 = pfVar1[1] - fVar113;
      fStack_1130 = pfVar1[2] - fVar113;
      fStack_112c = pfVar1[3] - fVar113;
      local_1148 = *pfVar3 - fVar93;
      fStack_1144 = pfVar3[1] - fVar93;
      fStack_1140 = pfVar3[2] - fVar93;
      fStack_113c = pfVar3[3] - fVar93;
      local_1158 = *pfVar4 - fVar82;
      fStack_1154 = pfVar4[1] - fVar82;
      fStack_1150 = pfVar4[2] - fVar82;
      fStack_114c = pfVar4[3] - fVar82;
      fVar147 = fVar175 - fVar113;
      fVar155 = fVar177 - fVar113;
      fVar156 = fVar180 - fVar113;
      fVar158 = fVar121 - fVar113;
      pfVar1 = (float *)(uVar30 + 0x40 + lVar21);
      fVar127 = *pfVar1;
      fVar128 = pfVar1[1];
      fVar169 = pfVar1[2];
      fVar171 = pfVar1[3];
      fVar94 = fVar127 - fVar93;
      fVar109 = fVar128 - fVar93;
      fVar110 = fVar169 - fVar93;
      fVar112 = fVar171 - fVar93;
      pfVar1 = (float *)(uVar30 + 0x50 + lVar21);
      fVar148 = *pfVar1;
      fVar129 = pfVar1[1];
      fVar157 = pfVar1[2];
      fVar159 = pfVar1[3];
      fVar130 = fVar148 - fVar82;
      fVar135 = fVar129 - fVar82;
      fVar136 = fVar157 - fVar82;
      fVar137 = fVar159 - fVar82;
      pfVar1 = (float *)(uVar30 + 0x90 + lVar21);
      local_1288 = *(undefined8 *)pfVar1;
      uStack_1280 = *(undefined8 *)(pfVar1 + 2);
      fVar95 = *pfVar1 - fVar113;
      fVar172 = pfVar1[1] - fVar113;
      fVar111 = pfVar1[2] - fVar113;
      fVar113 = pfVar1[3] - fVar113;
      pfVar1 = (float *)(uVar30 + 0xa0 + lVar21);
      local_1338 = *(undefined8 *)pfVar1;
      uStack_1330 = *(undefined8 *)(pfVar1 + 2);
      fVar83 = *pfVar1 - fVar93;
      fVar91 = pfVar1[1] - fVar93;
      fVar92 = pfVar1[2] - fVar93;
      fVar93 = pfVar1[3] - fVar93;
      pfVar1 = (float *)(uVar30 + 0xb0 + lVar21);
      local_1398 = *(undefined8 *)pfVar1;
      uStack_1390 = *(undefined8 *)(pfVar1 + 2);
      fVar65 = *pfVar1 - fVar82;
      fVar79 = pfVar1[1] - fVar82;
      fVar81 = pfVar1[2] - fVar82;
      fVar82 = pfVar1[3] - fVar82;
      local_1168._0_4_ = fVar95 - local_1138;
      local_1168._4_4_ = fVar172 - fStack_1134;
      fStack_1160 = fVar111 - fStack_1130;
      fStack_115c = fVar113 - fStack_112c;
      local_1188._0_4_ = fVar83 - local_1148;
      local_1188._4_4_ = fVar91 - fStack_1144;
      fStack_1180 = fVar92 - fStack_1140;
      fStack_117c = fVar93 - fStack_113c;
      local_1178 = fVar65 - local_1158;
      fStack_1174 = fVar79 - fStack_1154;
      fStack_1170 = fVar81 - fStack_1150;
      fStack_116c = fVar82 - fStack_114c;
      fVar161 = *(float *)(ray + k * 4 + 0x50);
      fVar164 = *(float *)(ray + k * 4 + 0x60);
      fVar165 = *(float *)(ray + k * 4 + 0x40);
      fVar183 = ((float)local_1188._0_4_ * (local_1158 + fVar65) -
                (local_1148 + fVar83) * local_1178) * fVar165 +
                ((local_1138 + fVar95) * local_1178 -
                (local_1158 + fVar65) * (float)local_1168._0_4_) * fVar161 +
                ((float)local_1168._0_4_ * (local_1148 + fVar83) -
                (local_1138 + fVar95) * (float)local_1188._0_4_) * fVar164;
      fVar118 = ((float)local_1188._4_4_ * (fStack_1154 + fVar79) -
                (fStack_1144 + fVar91) * fStack_1174) * fVar165 +
                ((fStack_1134 + fVar172) * fStack_1174 -
                (fStack_1154 + fVar79) * (float)local_1168._4_4_) * fVar161 +
                ((float)local_1168._4_4_ * (fStack_1144 + fVar91) -
                (fStack_1134 + fVar172) * (float)local_1188._4_4_) * fVar164;
      uVar114 = CONCAT44(fVar118,fVar183);
      fVar119 = (fStack_1180 * (fStack_1150 + fVar81) - (fStack_1140 + fVar92) * fStack_1170) *
                fVar165 + ((fStack_1130 + fVar111) * fStack_1170 -
                          (fStack_1150 + fVar81) * fStack_1160) * fVar161 +
                          (fStack_1160 * (fStack_1140 + fVar92) -
                          (fStack_1130 + fVar111) * fStack_1180) * fVar164;
      fVar120 = (fStack_117c * (fStack_114c + fVar82) - (fStack_113c + fVar93) * fStack_116c) *
                fVar165 + ((fStack_112c + fVar113) * fStack_116c -
                          (fStack_114c + fVar82) * fStack_115c) * fVar161 +
                          (fStack_115c * (fStack_113c + fVar93) -
                          (fStack_112c + fVar113) * fStack_117c) * fVar164;
      local_f98 = local_1138 - fVar147;
      fStack_f94 = fStack_1134 - fVar155;
      fStack_f90 = fStack_1130 - fVar156;
      fStack_f8c = fStack_112c - fVar158;
      fVar138 = local_1148 - fVar94;
      fVar142 = fStack_1144 - fVar109;
      fVar143 = fStack_1140 - fVar110;
      fVar144 = fStack_113c - fVar112;
      fVar31 = local_1158 - fVar130;
      fVar62 = fStack_1154 - fVar135;
      fVar63 = fStack_1150 - fVar136;
      fVar64 = fStack_114c - fVar137;
      local_fc8._0_4_ =
           (fVar138 * (local_1158 + fVar130) - (local_1148 + fVar94) * fVar31) * fVar165 +
           ((local_1138 + fVar147) * fVar31 - (local_1158 + fVar130) * local_f98) * fVar161 +
           (local_f98 * (local_1148 + fVar94) - (local_1138 + fVar147) * fVar138) * fVar164;
      local_fc8._4_4_ =
           (fVar142 * (fStack_1154 + fVar135) - (fStack_1144 + fVar109) * fVar62) * fVar165 +
           ((fStack_1134 + fVar155) * fVar62 - (fStack_1154 + fVar135) * fStack_f94) * fVar161 +
           (fStack_f94 * (fStack_1144 + fVar109) - (fStack_1134 + fVar155) * fVar142) * fVar164;
      local_fc8._8_4_ =
           (fVar143 * (fStack_1150 + fVar136) - (fStack_1140 + fVar110) * fVar63) * fVar165 +
           ((fStack_1130 + fVar156) * fVar63 - (fStack_1150 + fVar136) * fStack_f90) * fVar161 +
           (fStack_f90 * (fStack_1140 + fVar110) - (fStack_1130 + fVar156) * fVar143) * fVar164;
      local_fc8._12_4_ =
           (fVar144 * (fStack_114c + fVar137) - (fStack_113c + fVar112) * fVar64) * fVar165 +
           ((fStack_112c + fVar158) * fVar64 - (fStack_114c + fVar137) * fStack_f8c) * fVar161 +
           (fStack_f8c * (fStack_113c + fVar112) - (fStack_112c + fVar158) * fVar144) * fVar164;
      local_fa8 = fVar147 - fVar95;
      fStack_fa4 = fVar155 - fVar172;
      fStack_fa0 = fVar156 - fVar111;
      fStack_f9c = fVar158 - fVar113;
      fVar166 = fVar94 - fVar83;
      fVar167 = fVar109 - fVar91;
      fVar168 = fVar110 - fVar92;
      fVar170 = fVar112 - fVar93;
      local_f88 = fVar130 - fVar65;
      fStack_f84 = fVar135 - fVar79;
      fStack_f80 = fVar136 - fVar81;
      fStack_f7c = fVar137 - fVar82;
      fVar65 = (fVar166 * (fVar65 + fVar130) - (fVar83 + fVar94) * local_f88) * fVar165 +
               ((fVar95 + fVar147) * local_f88 - (fVar65 + fVar130) * local_fa8) * fVar161 +
               (local_fa8 * (fVar83 + fVar94) - (fVar95 + fVar147) * fVar166) * fVar164;
      fVar94 = (fVar167 * (fVar79 + fVar135) - (fVar91 + fVar109) * fStack_f84) * fVar165 +
               ((fVar172 + fVar155) * fStack_f84 - (fVar79 + fVar135) * fStack_fa4) * fVar161 +
               (fStack_fa4 * (fVar91 + fVar109) - (fVar172 + fVar155) * fVar167) * fVar164;
      fVar92 = (fVar168 * (fVar81 + fVar136) - (fVar92 + fVar110) * fStack_f80) * fVar165 +
               ((fVar111 + fVar156) * fStack_f80 - (fVar81 + fVar136) * fStack_fa0) * fVar161 +
               (fStack_fa0 * (fVar92 + fVar110) - (fVar111 + fVar156) * fVar168) * fVar164;
      fVar113 = (fVar170 * (fVar82 + fVar137) - (fVar93 + fVar112) * fStack_f7c) * fVar165 +
                ((fVar113 + fVar158) * fStack_f7c - (fVar82 + fVar137) * fStack_f9c) * fVar161 +
                (fStack_f9c * (fVar93 + fVar112) - (fVar113 + fVar158) * fVar170) * fVar164;
      fVar79 = local_fc8._0_4_ + fVar183 + fVar65;
      fVar81 = local_fc8._4_4_ + fVar118 + fVar94;
      fVar83 = local_fc8._8_4_ + fVar119 + fVar92;
      fVar91 = local_fc8._12_4_ + fVar120 + fVar113;
      auVar41._8_4_ = fVar119;
      auVar41._0_8_ = uVar114;
      auVar41._12_4_ = fVar120;
      auVar88 = minps(auVar41,local_fc8);
      auVar10._4_4_ = fVar94;
      auVar10._0_4_ = fVar65;
      auVar10._8_4_ = fVar92;
      auVar10._12_4_ = fVar113;
      auVar88 = minps(auVar88,auVar10);
      auVar149._8_4_ = fVar119;
      auVar149._0_8_ = uVar114;
      auVar149._12_4_ = fVar120;
      auVar150 = maxps(auVar149,local_fc8);
      auVar11._4_4_ = fVar94;
      auVar11._0_4_ = fVar65;
      auVar11._8_4_ = fVar92;
      auVar11._12_4_ = fVar113;
      auVar150 = maxps(auVar150,auVar11);
      fVar113 = ABS(fVar79) * 1.1920929e-07;
      fVar93 = ABS(fVar81) * 1.1920929e-07;
      fVar82 = ABS(fVar83) * 1.1920929e-07;
      fVar65 = ABS(fVar91) * 1.1920929e-07;
      auVar151._4_4_ = -(uint)(auVar150._4_4_ <= fVar93);
      auVar151._0_4_ = -(uint)(auVar150._0_4_ <= fVar113);
      auVar151._8_4_ = -(uint)(auVar150._8_4_ <= fVar82);
      auVar151._12_4_ = -(uint)(auVar150._12_4_ <= fVar65);
      auVar42._4_4_ = -(uint)(-fVar93 <= auVar88._4_4_);
      auVar42._0_4_ = -(uint)(-fVar113 <= auVar88._0_4_);
      auVar42._8_4_ = -(uint)(-fVar82 <= auVar88._8_4_);
      auVar42._12_4_ = -(uint)(-fVar65 <= auVar88._12_4_);
      auVar151 = auVar151 | auVar42;
      lVar2 = uVar30 + lVar21;
      uVar19 = (undefined4)((ulong)lVar21 >> 0x20);
      uVar16 = movmskps((int)lVar21,auVar151);
      if (uVar16 != 0) {
        tNear.field_0.v[2] = fVar119;
        tNear.field_0._0_8_ = uVar114;
        tNear.field_0.v[3] = fVar120;
        local_fd8 = fVar79;
        fStack_fd4 = fVar81;
        fStack_fd0 = fVar83;
        fStack_fcc = fVar91;
        local_fb8 = fVar166;
        fStack_fb4 = fVar167;
        fStack_fb0 = fVar168;
        fStack_fac = fVar170;
        auVar184._0_4_ = (float)local_1188._0_4_ * fVar31 - fVar138 * local_1178;
        auVar184._4_4_ = (float)local_1188._4_4_ * fVar62 - fVar142 * fStack_1174;
        auVar184._8_4_ = fStack_1180 * fVar63 - fVar143 * fStack_1170;
        auVar184._12_4_ = fStack_117c * fVar64 - fVar144 * fStack_116c;
        auVar139._0_4_ = fVar138 * local_f88 - fVar31 * fVar166;
        auVar139._4_4_ = fVar142 * fStack_f84 - fVar62 * fVar167;
        auVar139._8_4_ = fVar143 * fStack_f80 - fVar63 * fVar168;
        auVar139._12_4_ = fVar144 * fStack_f7c - fVar64 * fVar170;
        auVar43._4_4_ = -(uint)(ABS(fVar142 * fStack_1174) < ABS(fVar62 * fVar167));
        auVar43._0_4_ = -(uint)(ABS(fVar138 * local_1178) < ABS(fVar31 * fVar166));
        auVar43._8_4_ = -(uint)(ABS(fVar143 * fStack_1170) < ABS(fVar63 * fVar168));
        auVar43._12_4_ = -(uint)(ABS(fVar144 * fStack_116c) < ABS(fVar64 * fVar170));
        local_11c8 = blendvps(auVar139,auVar184,auVar43);
        auVar100._0_4_ = local_1178 * local_f98 - fVar31 * (float)local_1168._0_4_;
        auVar100._4_4_ = fStack_1174 * fStack_f94 - fVar62 * (float)local_1168._4_4_;
        auVar100._8_4_ = fStack_1170 * fStack_f90 - fVar63 * fStack_1160;
        auVar100._12_4_ = fStack_116c * fStack_f8c - fVar64 * fStack_115c;
        auVar145._0_4_ = fVar31 * local_fa8 - local_f98 * local_f88;
        auVar145._4_4_ = fVar62 * fStack_fa4 - fStack_f94 * fStack_f84;
        auVar145._8_4_ = fVar63 * fStack_fa0 - fStack_f90 * fStack_f80;
        auVar145._12_4_ = fVar64 * fStack_f9c - fStack_f8c * fStack_f7c;
        auVar44._4_4_ =
             -(uint)(ABS(fVar62 * (float)local_1168._4_4_) < ABS(fStack_f94 * fStack_f84));
        auVar44._0_4_ = -(uint)(ABS(fVar31 * (float)local_1168._0_4_) < ABS(local_f98 * local_f88));
        auVar44._8_4_ = -(uint)(ABS(fVar63 * fStack_1160) < ABS(fStack_f90 * fStack_f80));
        auVar44._12_4_ = -(uint)(ABS(fVar64 * fStack_115c) < ABS(fStack_f8c * fStack_f7c));
        local_11b8 = blendvps(auVar145,auVar100,auVar44);
        auVar162._0_4_ = (float)local_1168._0_4_ * fVar138 - local_f98 * (float)local_1188._0_4_;
        auVar162._4_4_ = (float)local_1168._4_4_ * fVar142 - fStack_f94 * (float)local_1188._4_4_;
        auVar162._8_4_ = fStack_1160 * fVar143 - fStack_f90 * fStack_1180;
        auVar162._12_4_ = fStack_115c * fVar144 - fStack_f8c * fStack_117c;
        auVar160._0_4_ = local_f98 * fVar166 - fVar138 * local_fa8;
        auVar160._4_4_ = fStack_f94 * fVar167 - fVar142 * fStack_fa4;
        auVar160._8_4_ = fStack_f90 * fVar168 - fVar143 * fStack_fa0;
        auVar160._12_4_ = fStack_f8c * fVar170 - fVar144 * fStack_f9c;
        auVar45._4_4_ =
             -(uint)(ABS(fStack_f94 * (float)local_1188._4_4_) < ABS(fVar142 * fStack_fa4));
        auVar45._0_4_ = -(uint)(ABS(local_f98 * (float)local_1188._0_4_) < ABS(fVar138 * local_fa8))
        ;
        auVar45._8_4_ = -(uint)(ABS(fStack_f90 * fStack_1180) < ABS(fVar143 * fStack_fa0));
        auVar45._12_4_ = -(uint)(ABS(fStack_f8c * fStack_117c) < ABS(fVar144 * fStack_f9c));
        local_11a8 = blendvps(auVar160,auVar162,auVar45);
        fVar113 = fVar165 * local_11c8._0_4_ +
                  fVar161 * local_11b8._0_4_ + fVar164 * local_11a8._0_4_;
        fVar93 = fVar165 * local_11c8._4_4_ +
                 fVar161 * local_11b8._4_4_ + fVar164 * local_11a8._4_4_;
        fVar82 = fVar165 * local_11c8._8_4_ +
                 fVar161 * local_11b8._8_4_ + fVar164 * local_11a8._8_4_;
        fVar161 = fVar165 * local_11c8._12_4_ +
                  fVar161 * local_11b8._12_4_ + fVar164 * local_11a8._12_4_;
        auVar125._0_4_ = fVar113 + fVar113;
        auVar125._4_4_ = fVar93 + fVar93;
        auVar125._8_4_ = fVar82 + fVar82;
        auVar125._12_4_ = fVar161 + fVar161;
        auVar46._0_4_ = local_1148 * local_11b8._0_4_ + local_1158 * local_11a8._0_4_;
        auVar46._4_4_ = fStack_1144 * local_11b8._4_4_ + fStack_1154 * local_11a8._4_4_;
        auVar46._8_4_ = fStack_1140 * local_11b8._8_4_ + fStack_1150 * local_11a8._8_4_;
        auVar46._12_4_ = fStack_113c * local_11b8._12_4_ + fStack_114c * local_11a8._12_4_;
        fVar113 = local_1138 * local_11c8._0_4_ + auVar46._0_4_;
        fVar93 = fStack_1134 * local_11c8._4_4_ + auVar46._4_4_;
        fVar82 = fStack_1130 * local_11c8._8_4_ + auVar46._8_4_;
        fVar161 = fStack_112c * local_11c8._12_4_ + auVar46._12_4_;
        auVar101._0_4_ = fVar113 + fVar113;
        auVar101._4_4_ = fVar93 + fVar93;
        auVar101._8_4_ = fVar82 + fVar82;
        auVar101._12_4_ = fVar161 + fVar161;
        auVar88 = rcpps(auVar46,auVar125);
        fVar113 = auVar88._0_4_;
        fVar93 = auVar88._4_4_;
        fVar82 = auVar88._8_4_;
        fVar161 = auVar88._12_4_;
        fVar164 = ((1.0 - auVar125._0_4_ * fVar113) * fVar113 + fVar113) * auVar101._0_4_;
        fVar165 = ((1.0 - auVar125._4_4_ * fVar93) * fVar93 + fVar93) * auVar101._4_4_;
        fVar82 = ((1.0 - auVar125._8_4_ * fVar82) * fVar82 + fVar82) * auVar101._8_4_;
        fVar161 = ((1.0 - auVar125._12_4_ * fVar161) * fVar161 + fVar161) * auVar101._12_4_;
        fVar113 = *(float *)(ray + k * 4 + 0x80);
        local_1368 = ZEXT416((uint)fVar113);
        fVar93 = *(float *)(ray + k * 4 + 0x30);
        auVar67._0_4_ = -(uint)(fVar164 <= fVar113 && fVar93 <= fVar164) & auVar151._0_4_;
        auVar67._4_4_ = -(uint)(fVar165 <= fVar113 && fVar93 <= fVar165) & auVar151._4_4_;
        auVar67._8_4_ = -(uint)(fVar82 <= fVar113 && fVar93 <= fVar82) & auVar151._8_4_;
        auVar67._12_4_ = -(uint)(fVar161 <= fVar113 && fVar93 <= fVar161) & auVar151._12_4_;
        uVar16 = movmskps(uVar16,auVar67);
        if (uVar16 != 0) {
          uVar66 = auVar67._0_4_ & -(uint)(auVar125._0_4_ != 0.0);
          uVar80 = auVar67._4_4_ & -(uint)(auVar125._4_4_ != 0.0);
          valid.field_0._0_8_ = CONCAT44(uVar80,uVar66);
          valid.field_0.i[2] = auVar67._8_4_ & -(uint)(auVar125._8_4_ != 0.0);
          valid.field_0.i[3] = auVar67._12_4_ & -(uint)(auVar125._12_4_ != 0.0);
          uVar16 = movmskps(uVar16,(undefined1  [16])valid.field_0);
          if (uVar16 != 0) {
            auVar15._4_4_ = fVar81;
            auVar15._0_4_ = fVar79;
            auVar15._8_4_ = fVar83;
            auVar15._12_4_ = fVar91;
            auVar140._4_4_ = fVar165;
            auVar140._0_4_ = fVar164;
            auVar140._8_4_ = fVar82;
            auVar140._12_4_ = fVar161;
            _local_11d8 = auVar140;
            local_1198._8_8_ = uStack_1060;
            local_1198._0_8_ = local_1068;
            pSVar8 = context->scene;
            auVar88 = rcpps(auVar101,auVar15);
            fVar93 = auVar88._0_4_;
            fVar175 = auVar88._4_4_;
            fVar177 = auVar88._8_4_;
            fVar180 = auVar88._12_4_;
            fVar121 = (float)DAT_01f46a60;
            fVar127 = DAT_01f46a60._4_4_;
            fVar128 = DAT_01f46a60._12_4_;
            fVar113 = DAT_01f46a60._8_4_;
            fVar93 = (float)(-(uint)(1e-18 <= ABS(fVar79)) &
                            (uint)((fVar121 - fVar79 * fVar93) * fVar93 + fVar93));
            fVar175 = (float)(-(uint)(1e-18 <= ABS(fVar81)) &
                             (uint)((fVar127 - fVar81 * fVar175) * fVar175 + fVar175));
            fVar177 = (float)(-(uint)(1e-18 <= ABS(fVar83)) &
                             (uint)((fVar113 - fVar83 * fVar177) * fVar177 + fVar177));
            fVar180 = (float)(-(uint)(1e-18 <= ABS(fVar91)) &
                             (uint)((fVar128 - fVar91 * fVar180) * fVar180 + fVar180));
            auVar133._0_4_ = fVar183 * fVar93;
            auVar133._4_4_ = fVar118 * fVar175;
            auVar133._8_4_ = fVar119 * fVar177;
            auVar133._12_4_ = fVar120 * fVar180;
            auVar88 = minps(auVar133,_DAT_01f46a60);
            auVar173._0_4_ = fVar93 * local_fc8._0_4_;
            auVar173._4_4_ = fVar175 * local_fc8._4_4_;
            auVar173._8_4_ = fVar177 * local_fc8._8_4_;
            auVar173._12_4_ = fVar180 * local_fc8._12_4_;
            auVar150 = minps(auVar173,_DAT_01f46a60);
            auVar89._0_4_ = fVar121 - auVar88._0_4_;
            auVar89._4_4_ = fVar127 - auVar88._4_4_;
            auVar89._8_4_ = fVar113 - auVar88._8_4_;
            auVar89._12_4_ = fVar128 - auVar88._12_4_;
            auVar102._0_4_ = fVar121 - auVar150._0_4_;
            auVar102._4_4_ = fVar127 - auVar150._4_4_;
            auVar102._8_4_ = fVar113 - auVar150._8_4_;
            auVar102._12_4_ = fVar128 - auVar150._12_4_;
            local_11f8 = blendvps(auVar88,auVar89,local_1198);
            local_11e8 = blendvps(auVar150,auVar102,local_1198);
            auVar47._8_4_ = valid.field_0.i[2];
            auVar47._0_8_ = valid.field_0._0_8_;
            auVar47._12_4_ = valid.field_0.i[3];
            auVar150 = blendvps(_DAT_01f45a30,auVar140,auVar47);
            auVar103._4_4_ = auVar150._0_4_;
            auVar103._0_4_ = auVar150._4_4_;
            auVar103._8_4_ = auVar150._12_4_;
            auVar103._12_4_ = auVar150._8_4_;
            auVar88 = minps(auVar103,auVar150);
            auVar48._0_8_ = auVar88._8_8_;
            auVar48._8_4_ = auVar88._0_4_;
            auVar48._12_4_ = auVar88._4_4_;
            auVar88 = minps(auVar48,auVar88);
            auVar49._0_8_ =
                 CONCAT44(-(uint)(auVar88._4_4_ == auVar150._4_4_) & uVar80,
                          -(uint)(auVar88._0_4_ == auVar150._0_4_) & uVar66);
            auVar49._8_4_ = -(uint)(auVar88._8_4_ == auVar150._8_4_) & valid.field_0.i[2];
            auVar49._12_4_ = -(uint)(auVar88._12_4_ == auVar150._12_4_) & valid.field_0.i[3];
            iVar17 = movmskps(uVar16,auVar49);
            aVar68 = valid.field_0;
            if (iVar17 != 0) {
              aVar68.i[2] = auVar49._8_4_;
              aVar68._0_8_ = auVar49._0_8_;
              aVar68.i[3] = auVar49._12_4_;
            }
            uVar18 = movmskps(iVar17,(undefined1  [16])aVar68);
            lVar21 = 0;
            if (CONCAT44(uVar19,uVar18) != 0) {
              for (; (CONCAT44(uVar19,uVar18) >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
              }
            }
LAB_0070f178:
            uVar16 = *(uint *)(lVar2 + 0xc0 + lVar21 * 4);
            pRVar22 = (RTCRayN *)(ulong)uVar16;
            pGVar9 = (pSVar8->geometries).items[(long)pRVar22].ptr;
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              valid.field_0.v[lVar21] = 0.0;
LAB_0070f4c9:
              uVar19 = (undefined4)((ulong)pRVar22 >> 0x20);
              uVar16 = movmskps((int)pRVar22,(undefined1  [16])valid.field_0);
              if (uVar16 == 0) goto LAB_0070f644;
              auVar150 = blendvps(_DAT_01f45a30,auVar140,(undefined1  [16])valid.field_0);
              auVar104._4_4_ = auVar150._0_4_;
              auVar104._0_4_ = auVar150._4_4_;
              auVar104._8_4_ = auVar150._12_4_;
              auVar104._12_4_ = auVar150._8_4_;
              auVar88 = minps(auVar104,auVar150);
              auVar70._0_8_ = auVar88._8_8_;
              auVar70._8_4_ = auVar88._0_4_;
              auVar70._12_4_ = auVar88._4_4_;
              auVar88 = minps(auVar70,auVar88);
              auVar71._0_8_ =
                   CONCAT44(-(uint)(auVar88._4_4_ == auVar150._4_4_) & valid.field_0._4_4_,
                            -(uint)(auVar88._0_4_ == auVar150._0_4_) & valid.field_0._0_4_);
              auVar71._8_4_ = -(uint)(auVar88._8_4_ == auVar150._8_4_) & valid.field_0._8_4_;
              auVar71._12_4_ = -(uint)(auVar88._12_4_ == auVar150._12_4_) & valid.field_0._12_4_;
              iVar17 = movmskps(uVar16,auVar71);
              aVar51 = valid.field_0;
              if (iVar17 != 0) {
                aVar51.i[2] = auVar71._8_4_;
                aVar51._0_8_ = auVar71._0_8_;
                aVar51.i[3] = auVar71._12_4_;
              }
              uVar18 = movmskps(iVar17,(undefined1  [16])aVar51);
              lVar21 = 0;
              if (CONCAT44(uVar19,uVar18) != 0) {
                for (; (CONCAT44(uVar19,uVar18) >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                }
              }
              goto LAB_0070f178;
            }
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              local_10d8 = *(undefined4 *)(local_11f8 + lVar21 * 4);
              local_10c8 = *(undefined4 *)(local_11e8 + lVar21 * 4);
              local_1108._4_4_ = *(undefined4 *)(local_11c8 + lVar21 * 4);
              local_10f8._4_4_ = *(undefined4 *)(local_11b8 + lVar21 * 4);
              local_10a8._4_4_ = uVar16;
              local_10a8._0_4_ = uVar16;
              local_10a8._8_4_ = uVar16;
              local_10a8._12_4_ = uVar16;
              uVar19 = *(undefined4 *)((long)&local_1278 + lVar21 * 4);
              local_10b8._4_4_ = uVar19;
              local_10b8._0_4_ = uVar19;
              local_10b8._8_4_ = uVar19;
              local_10b8._12_4_ = uVar19;
              uVar19 = *(undefined4 *)(local_11a8 + lVar21 * 4);
              local_10e8._4_4_ = uVar19;
              local_10e8._0_4_ = uVar19;
              local_10e8._8_4_ = uVar19;
              local_10e8._12_4_ = uVar19;
              local_1108._0_4_ = local_1108._4_4_;
              local_1108._8_4_ = local_1108._4_4_;
              local_1108._12_4_ = local_1108._4_4_;
              local_10f8._0_4_ = local_10f8._4_4_;
              local_10f8._8_4_ = local_10f8._4_4_;
              local_10f8._12_4_ = local_10f8._4_4_;
              uStack_10d4 = local_10d8;
              uStack_10d0 = local_10d8;
              uStack_10cc = local_10d8;
              uStack_10c4 = local_10c8;
              uStack_10c0 = local_10c8;
              uStack_10bc = local_10c8;
              local_1098 = context->user->instID[0];
              uStack_1094 = local_1098;
              uStack_1090 = local_1098;
              uStack_108c = local_1098;
              local_1088 = context->user->instPrimID[0];
              uStack_1084 = local_1088;
              uStack_1080 = local_1088;
              uStack_107c = local_1088;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11d8 + lVar21 * 4);
              local_1318 = *(undefined1 (*) [16])
                            (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
              args.valid = (int *)local_1318;
              args.geometryUserPtr = pGVar9->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)local_1108;
              args.N = 4;
              pRVar22 = (RTCRayN *)pGVar9->intersectionFilterN;
              args.ray = (RTCRayN *)ray;
              if (pRVar22 != (RTCRayN *)0x0) {
                pRVar22 = (RTCRayN *)(*(code *)pRVar22)(&args);
              }
              if (local_1318 == (undefined1  [16])0x0) {
                auVar69._8_4_ = 0xffffffff;
                auVar69._0_8_ = 0xffffffffffffffff;
                auVar69._12_4_ = 0xffffffff;
                auVar69 = auVar69 ^ _DAT_01f46b70;
              }
              else {
                pRVar22 = (RTCRayN *)context->args->filter;
                if ((pRVar22 != (RTCRayN *)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))))
                {
                  pRVar22 = (RTCRayN *)(*(code *)pRVar22)(&args);
                }
                auVar50._0_4_ = -(uint)(local_1318._0_4_ == 0);
                auVar50._4_4_ = -(uint)(local_1318._4_4_ == 0);
                auVar50._8_4_ = -(uint)(local_1318._8_4_ == 0);
                auVar50._12_4_ = -(uint)(local_1318._12_4_ == 0);
                auVar69 = auVar50 ^ _DAT_01f46b70;
                if (local_1318 != (undefined1  [16])0x0) {
                  auVar88 = blendvps(*(undefined1 (*) [16])args.hit,
                                     *(undefined1 (*) [16])(args.ray + 0xc0),auVar50);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar88;
                  auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                     *(undefined1 (*) [16])(args.ray + 0xd0),auVar50);
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar88;
                  auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                     *(undefined1 (*) [16])(args.ray + 0xe0),auVar50);
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar88;
                  auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                     *(undefined1 (*) [16])(args.ray + 0xf0),auVar50);
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar88;
                  auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                     *(undefined1 (*) [16])(args.ray + 0x100),auVar50);
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar88;
                  auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                     *(undefined1 (*) [16])(args.ray + 0x110),auVar50);
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar88;
                  auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                     *(undefined1 (*) [16])(args.ray + 0x120),auVar50);
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar88;
                  auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                     *(undefined1 (*) [16])(args.ray + 0x130),auVar50);
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar88;
                  auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                     *(undefined1 (*) [16])(args.ray + 0x140),auVar50);
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar88;
                  pRVar22 = args.ray;
                }
              }
              if ((_DAT_01f46b40 & auVar69) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = local_1368._0_4_;
              }
              else {
                local_1368._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                local_1368._4_4_ = 0;
                local_1368._8_4_ = 0;
                local_1368._12_4_ = 0;
              }
              valid.field_0.v[lVar21] = 0.0;
              valid.field_0.i[0] =
                   -(uint)(auVar140._0_4_ <= (float)local_1368._0_4_) & valid.field_0.i[0];
              valid.field_0.i[1] =
                   -(uint)(auVar140._4_4_ <= (float)local_1368._0_4_) & valid.field_0.i[1];
              valid.field_0.i[2] =
                   -(uint)(auVar140._8_4_ <= (float)local_1368._0_4_) & valid.field_0.i[2];
              valid.field_0.i[3] =
                   -(uint)(auVar140._12_4_ <= (float)local_1368._0_4_) & valid.field_0.i[3];
              goto LAB_0070f4c9;
            }
            uVar19 = *(undefined4 *)(local_11f8 + lVar21 * 4);
            uVar18 = *(undefined4 *)(local_11e8 + lVar21 * 4);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11d8 + lVar21 * 4);
            *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_11c8 + lVar21 * 4);
            *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_11b8 + lVar21 * 4);
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_11a8 + lVar21 * 4);
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar19;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar18;
            *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_1278 + lVar21 * 4);
            *(uint *)(ray + k * 4 + 0x120) = uVar16;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            uVar16 = context->user->instPrimID[0];
            uVar19 = 0;
            *(uint *)(ray + k * 4 + 0x140) = uVar16;
LAB_0070f644:
            fVar175 = *(float *)(lVar2 + 0x30);
            fVar177 = *(float *)(lVar2 + 0x34);
            fVar180 = *(float *)(lVar2 + 0x38);
            fVar121 = *(float *)(lVar2 + 0x3c);
            fVar127 = *(float *)(lVar2 + 0x40);
            fVar128 = *(float *)(lVar2 + 0x44);
            fVar169 = *(float *)(lVar2 + 0x48);
            fVar171 = *(float *)(lVar2 + 0x4c);
            fVar148 = *(float *)(lVar2 + 0x50);
            fVar129 = *(float *)(lVar2 + 0x54);
            fVar157 = *(float *)(lVar2 + 0x58);
            fVar159 = *(float *)(lVar2 + 0x5c);
            local_1288 = *(undefined8 *)(lVar2 + 0x90);
            uStack_1280 = *(undefined8 *)(lVar2 + 0x98);
            local_1338 = *(undefined8 *)(lVar2 + 0xa0);
            uStack_1330 = *(undefined8 *)(lVar2 + 0xa8);
            local_1398 = *(undefined8 *)(lVar2 + 0xb0);
            uStack_1390 = *(undefined8 *)(lVar2 + 0xb8);
          }
        }
      }
      fVar113 = *(float *)(ray + k * 4);
      fVar93 = *(float *)(ray + k * 4 + 0x10);
      fVar82 = *(float *)(ray + k * 4 + 0x20);
      fVar110 = *(float *)(lVar2 + 0x60) - fVar113;
      fVar111 = *(float *)(lVar2 + 100) - fVar113;
      fVar112 = *(float *)(lVar2 + 0x68) - fVar113;
      fVar183 = *(float *)(lVar2 + 0x6c) - fVar113;
      fVar167 = *(float *)(lVar2 + 0x70) - fVar93;
      fVar170 = *(float *)(lVar2 + 0x74) - fVar93;
      fVar178 = *(float *)(lVar2 + 0x78) - fVar93;
      fVar181 = *(float *)(lVar2 + 0x7c) - fVar93;
      fVar135 = *(float *)(lVar2 + 0x80) - fVar82;
      fVar136 = *(float *)(lVar2 + 0x84) - fVar82;
      fVar137 = *(float *)(lVar2 + 0x88) - fVar82;
      fVar138 = *(float *)(lVar2 + 0x8c) - fVar82;
      local_1288._0_4_ = (float)local_1288 - fVar113;
      local_1288._4_4_ = local_1288._4_4_ - fVar113;
      uStack_1280._0_4_ = (float)uStack_1280 - fVar113;
      uStack_1280._4_4_ = uStack_1280._4_4_ - fVar113;
      local_1338._0_4_ = (float)local_1338 - fVar93;
      local_1338._4_4_ = local_1338._4_4_ - fVar93;
      uStack_1330._0_4_ = (float)uStack_1330 - fVar93;
      uStack_1330._4_4_ = uStack_1330._4_4_ - fVar93;
      local_1398._0_4_ = (float)local_1398 - fVar82;
      local_1398._4_4_ = local_1398._4_4_ - fVar82;
      uStack_1390._0_4_ = (float)uStack_1390 - fVar82;
      uStack_1390._4_4_ = uStack_1390._4_4_ - fVar82;
      fVar175 = fVar175 - fVar113;
      fVar177 = fVar177 - fVar113;
      fVar180 = fVar180 - fVar113;
      fVar121 = fVar121 - fVar113;
      fVar127 = fVar127 - fVar93;
      fVar128 = fVar128 - fVar93;
      fVar169 = fVar169 - fVar93;
      fVar171 = fVar171 - fVar93;
      fVar148 = fVar148 - fVar82;
      fVar129 = fVar129 - fVar82;
      fVar157 = fVar157 - fVar82;
      fVar159 = fVar159 - fVar82;
      fVar65 = fVar175 - fVar110;
      fVar79 = fVar177 - fVar111;
      fVar81 = fVar180 - fVar112;
      fVar83 = fVar121 - fVar183;
      fVar142 = fVar127 - fVar167;
      fVar143 = fVar128 - fVar170;
      fVar144 = fVar169 - fVar178;
      fVar147 = fVar171 - fVar181;
      fVar118 = fVar148 - fVar135;
      fVar119 = fVar129 - fVar136;
      fVar120 = fVar157 - fVar137;
      fVar130 = fVar159 - fVar138;
      fVar113 = *(float *)(ray + k * 4 + 0x50);
      local_1138 = *(float *)(ray + k * 4 + 0x60);
      fVar93 = *(float *)(ray + k * 4 + 0x40);
      fVar109 = (fVar142 * (fVar135 + fVar148) - (fVar167 + fVar127) * fVar118) * fVar93 +
                ((fVar110 + fVar175) * fVar118 - (fVar135 + fVar148) * fVar65) * fVar113 +
                (fVar65 * (fVar167 + fVar127) - (fVar110 + fVar175) * fVar142) * local_1138;
      fVar172 = (fVar143 * (fVar136 + fVar129) - (fVar170 + fVar128) * fVar119) * fVar93 +
                ((fVar111 + fVar177) * fVar119 - (fVar136 + fVar129) * fVar79) * fVar113 +
                (fVar79 * (fVar170 + fVar128) - (fVar111 + fVar177) * fVar143) * local_1138;
      local_1188 = (undefined1  [8])CONCAT44(fVar172,fVar109);
      fStack_1180 = (fVar144 * (fVar137 + fVar157) - (fVar178 + fVar169) * fVar120) * fVar93 +
                    ((fVar112 + fVar180) * fVar120 - (fVar137 + fVar157) * fVar81) * fVar113 +
                    (fVar81 * (fVar178 + fVar169) - (fVar112 + fVar180) * fVar144) * local_1138;
      fStack_117c = (fVar147 * (fVar138 + fVar159) - (fVar181 + fVar171) * fVar130) * fVar93 +
                    ((fVar183 + fVar121) * fVar130 - (fVar138 + fVar159) * fVar83) * fVar113 +
                    (fVar83 * (fVar181 + fVar171) - (fVar183 + fVar121) * fVar147) * local_1138;
      fVar31 = fVar110 - (float)local_1288;
      fVar62 = fVar111 - local_1288._4_4_;
      fVar63 = fVar112 - (float)uStack_1280;
      fVar64 = fVar183 - uStack_1280._4_4_;
      fVar155 = fVar167 - (float)local_1338;
      fVar156 = fVar170 - local_1338._4_4_;
      fVar158 = fVar178 - (float)uStack_1330;
      fVar166 = fVar181 - uStack_1330._4_4_;
      fVar91 = fVar135 - (float)local_1398;
      fVar92 = fVar136 - local_1398._4_4_;
      fVar94 = fVar137 - (float)uStack_1390;
      fVar95 = fVar138 - uStack_1390._4_4_;
      local_1168._0_4_ =
           (fVar155 * (fVar135 + (float)local_1398) - (fVar167 + (float)local_1338) * fVar91) *
           fVar93 + ((fVar110 + (float)local_1288) * fVar91 - (fVar135 + (float)local_1398) * fVar31
                    ) * fVar113 +
                    (fVar31 * (fVar167 + (float)local_1338) -
                    (fVar110 + (float)local_1288) * fVar155) * local_1138;
      local_1168._4_4_ =
           (fVar156 * (fVar136 + local_1398._4_4_) - (fVar170 + local_1338._4_4_) * fVar92) * fVar93
           + ((fVar111 + local_1288._4_4_) * fVar92 - (fVar136 + local_1398._4_4_) * fVar62) *
             fVar113 + (fVar62 * (fVar170 + local_1338._4_4_) -
                       (fVar111 + local_1288._4_4_) * fVar156) * local_1138;
      fStack_1160 = (fVar158 * (fVar137 + (float)uStack_1390) -
                    (fVar178 + (float)uStack_1330) * fVar94) * fVar93 +
                    ((fVar112 + (float)uStack_1280) * fVar94 -
                    (fVar137 + (float)uStack_1390) * fVar63) * fVar113 +
                    (fVar63 * (fVar178 + (float)uStack_1330) -
                    (fVar112 + (float)uStack_1280) * fVar158) * local_1138;
      fStack_115c = (fVar166 * (fVar138 + uStack_1390._4_4_) -
                    (fVar181 + uStack_1330._4_4_) * fVar95) * fVar93 +
                    ((fVar183 + uStack_1280._4_4_) * fVar95 - (fVar138 + uStack_1390._4_4_) * fVar64
                    ) * fVar113 +
                    (fVar64 * (fVar181 + uStack_1330._4_4_) -
                    (fVar183 + uStack_1280._4_4_) * fVar166) * local_1138;
      local_1158 = (float)local_1288 - fVar175;
      fStack_1154 = local_1288._4_4_ - fVar177;
      fStack_1150 = (float)uStack_1280 - fVar180;
      fStack_114c = uStack_1280._4_4_ - fVar121;
      local_1148 = (float)local_1338 - fVar127;
      fStack_1144 = local_1338._4_4_ - fVar128;
      fStack_1140 = (float)uStack_1330 - fVar169;
      fStack_113c = uStack_1330._4_4_ - fVar171;
      fVar168 = (float)local_1398 - fVar148;
      fVar176 = local_1398._4_4_ - fVar129;
      fVar179 = (float)uStack_1390 - fVar157;
      fVar182 = uStack_1390._4_4_ - fVar159;
      fStack_1134 = local_1138;
      fStack_1130 = local_1138;
      fStack_112c = local_1138;
      auVar52._0_4_ =
           (local_1148 * (fVar148 + (float)local_1398) - (fVar127 + (float)local_1338) * fVar168) *
           fVar93 + ((fVar175 + (float)local_1288) * fVar168 -
                    (fVar148 + (float)local_1398) * local_1158) * fVar113 +
                    (local_1158 * (fVar127 + (float)local_1338) -
                    (fVar175 + (float)local_1288) * local_1148) * local_1138;
      auVar52._4_4_ =
           (fStack_1144 * (fVar129 + local_1398._4_4_) - (fVar128 + local_1338._4_4_) * fVar176) *
           fVar93 + ((fVar177 + local_1288._4_4_) * fVar176 -
                    (fVar129 + local_1398._4_4_) * fStack_1154) * fVar113 +
                    (fStack_1154 * (fVar128 + local_1338._4_4_) -
                    (fVar177 + local_1288._4_4_) * fStack_1144) * local_1138;
      auVar52._8_4_ =
           (fStack_1140 * (fVar157 + (float)uStack_1390) - (fVar169 + (float)uStack_1330) * fVar179)
           * fVar93 +
           ((fVar180 + (float)uStack_1280) * fVar179 - (fVar157 + (float)uStack_1390) * fStack_1150)
           * fVar113 +
           (fStack_1150 * (fVar169 + (float)uStack_1330) -
           (fVar180 + (float)uStack_1280) * fStack_1140) * local_1138;
      auVar52._12_4_ =
           (fStack_113c * (fVar159 + uStack_1390._4_4_) - (fVar171 + uStack_1330._4_4_) * fVar182) *
           fVar93 + ((fVar121 + uStack_1280._4_4_) * fVar182 -
                    (fVar159 + uStack_1390._4_4_) * fStack_114c) * fVar113 +
                    (fStack_114c * (fVar171 + uStack_1330._4_4_) -
                    (fVar121 + uStack_1280._4_4_) * fStack_113c) * local_1138;
      local_1178 = (float)local_1168._0_4_ + fVar109 + auVar52._0_4_;
      fStack_1174 = (float)local_1168._4_4_ + fVar172 + auVar52._4_4_;
      fStack_1170 = fStack_1160 + fStack_1180 + auVar52._8_4_;
      fStack_116c = fStack_115c + fStack_117c + auVar52._12_4_;
      auVar72._8_4_ = fStack_1180;
      auVar72._0_8_ = local_1188;
      auVar72._12_4_ = fStack_117c;
      auVar88 = minps(auVar72,_local_1168);
      auVar88 = minps(auVar88,auVar52);
      auVar152._8_4_ = fStack_1180;
      auVar152._0_8_ = local_1188;
      auVar152._12_4_ = fStack_117c;
      auVar150 = maxps(auVar152,_local_1168);
      auVar150 = maxps(auVar150,auVar52);
      fVar82 = ABS(local_1178) * 1.1920929e-07;
      fVar161 = ABS(fStack_1174) * 1.1920929e-07;
      fVar164 = ABS(fStack_1170) * 1.1920929e-07;
      fVar165 = ABS(fStack_116c) * 1.1920929e-07;
      auVar153._4_4_ = -(uint)(auVar150._4_4_ <= fVar161);
      auVar153._0_4_ = -(uint)(auVar150._0_4_ <= fVar82);
      auVar153._8_4_ = -(uint)(auVar150._8_4_ <= fVar164);
      auVar153._12_4_ = -(uint)(auVar150._12_4_ <= fVar165);
      auVar73._4_4_ = -(uint)(-fVar161 <= auVar88._4_4_);
      auVar73._0_4_ = -(uint)(-fVar82 <= auVar88._0_4_);
      auVar73._8_4_ = -(uint)(-fVar164 <= auVar88._8_4_);
      auVar73._12_4_ = -(uint)(-fVar165 <= auVar88._12_4_);
      auVar153 = auVar153 | auVar73;
      iVar17 = movmskps(uVar16,auVar153);
      if (iVar17 != 0) {
        auVar146._0_4_ = fVar142 * fVar91 - fVar155 * fVar118;
        auVar146._4_4_ = fVar143 * fVar92 - fVar156 * fVar119;
        auVar146._8_4_ = fVar144 * fVar94 - fVar158 * fVar120;
        auVar146._12_4_ = fVar147 * fVar95 - fVar166 * fVar130;
        auVar163._0_4_ = fVar155 * fVar168 - fVar91 * local_1148;
        auVar163._4_4_ = fVar156 * fVar176 - fVar92 * fStack_1144;
        auVar163._8_4_ = fVar158 * fVar179 - fVar94 * fStack_1140;
        auVar163._12_4_ = fVar166 * fVar182 - fVar95 * fStack_113c;
        auVar53._4_4_ = -(uint)(ABS(fVar156 * fVar119) < ABS(fVar92 * fStack_1144));
        auVar53._0_4_ = -(uint)(ABS(fVar155 * fVar118) < ABS(fVar91 * local_1148));
        auVar53._8_4_ = -(uint)(ABS(fVar158 * fVar120) < ABS(fVar94 * fStack_1140));
        auVar53._12_4_ = -(uint)(ABS(fVar166 * fVar130) < ABS(fVar95 * fStack_113c));
        local_11c8 = blendvps(auVar163,auVar146,auVar53);
        auVar105._0_4_ = fVar118 * fVar31 - fVar91 * fVar65;
        auVar105._4_4_ = fVar119 * fVar62 - fVar92 * fVar79;
        auVar105._8_4_ = fVar120 * fVar63 - fVar94 * fVar81;
        auVar105._12_4_ = fVar130 * fVar64 - fVar95 * fVar83;
        auVar117._0_4_ = fVar91 * local_1158 - fVar31 * fVar168;
        auVar117._4_4_ = fVar92 * fStack_1154 - fVar62 * fVar176;
        auVar117._8_4_ = fVar94 * fStack_1150 - fVar63 * fVar179;
        auVar117._12_4_ = fVar95 * fStack_114c - fVar64 * fVar182;
        auVar54._4_4_ = -(uint)(ABS(fVar92 * fVar79) < ABS(fVar62 * fVar176));
        auVar54._0_4_ = -(uint)(ABS(fVar91 * fVar65) < ABS(fVar31 * fVar168));
        auVar54._8_4_ = -(uint)(ABS(fVar94 * fVar81) < ABS(fVar63 * fVar179));
        auVar54._12_4_ = -(uint)(ABS(fVar95 * fVar83) < ABS(fVar64 * fVar182));
        local_11b8 = blendvps(auVar117,auVar105,auVar54);
        auVar174._0_4_ = fVar65 * fVar155 - fVar31 * fVar142;
        auVar174._4_4_ = fVar79 * fVar156 - fVar62 * fVar143;
        auVar174._8_4_ = fVar81 * fVar158 - fVar63 * fVar144;
        auVar174._12_4_ = fVar83 * fVar166 - fVar64 * fVar147;
        auVar134._0_4_ = fVar31 * local_1148 - fVar155 * local_1158;
        auVar134._4_4_ = fVar62 * fStack_1144 - fVar156 * fStack_1154;
        auVar134._8_4_ = fVar63 * fStack_1140 - fVar158 * fStack_1150;
        auVar134._12_4_ = fVar64 * fStack_113c - fVar166 * fStack_114c;
        auVar55._4_4_ = -(uint)(ABS(fVar62 * fVar143) < ABS(fVar156 * fStack_1154));
        auVar55._0_4_ = -(uint)(ABS(fVar31 * fVar142) < ABS(fVar155 * local_1158));
        auVar55._8_4_ = -(uint)(ABS(fVar63 * fVar144) < ABS(fVar158 * fStack_1150));
        auVar55._12_4_ = -(uint)(ABS(fVar64 * fVar147) < ABS(fVar166 * fStack_114c));
        local_11a8 = blendvps(auVar134,auVar174,auVar55);
        fVar82 = fVar93 * local_11c8._0_4_ +
                 fVar113 * local_11b8._0_4_ + local_1138 * local_11a8._0_4_;
        fVar161 = fVar93 * local_11c8._4_4_ +
                  fVar113 * local_11b8._4_4_ + local_1138 * local_11a8._4_4_;
        fVar164 = fVar93 * local_11c8._8_4_ +
                  fVar113 * local_11b8._8_4_ + local_1138 * local_11a8._8_4_;
        fVar113 = fVar93 * local_11c8._12_4_ +
                  fVar113 * local_11b8._12_4_ + local_1138 * local_11a8._12_4_;
        auVar141._0_4_ = fVar82 + fVar82;
        auVar141._4_4_ = fVar161 + fVar161;
        auVar141._8_4_ = fVar164 + fVar164;
        auVar141._12_4_ = fVar113 + fVar113;
        auVar56._0_4_ = fVar167 * local_11b8._0_4_ + fVar135 * local_11a8._0_4_;
        auVar56._4_4_ = fVar170 * local_11b8._4_4_ + fVar136 * local_11a8._4_4_;
        auVar56._8_4_ = fVar178 * local_11b8._8_4_ + fVar137 * local_11a8._8_4_;
        auVar56._12_4_ = fVar181 * local_11b8._12_4_ + fVar138 * local_11a8._12_4_;
        fVar113 = fVar110 * local_11c8._0_4_ + auVar56._0_4_;
        fVar93 = fVar111 * local_11c8._4_4_ + auVar56._4_4_;
        fVar82 = fVar112 * local_11c8._8_4_ + auVar56._8_4_;
        fVar161 = fVar183 * local_11c8._12_4_ + auVar56._12_4_;
        auVar126._0_4_ = fVar113 + fVar113;
        auVar126._4_4_ = fVar93 + fVar93;
        auVar126._8_4_ = fVar82 + fVar82;
        auVar126._12_4_ = fVar161 + fVar161;
        auVar88 = rcpps(auVar56,auVar141);
        fVar113 = auVar88._0_4_;
        fVar93 = auVar88._4_4_;
        fVar82 = auVar88._8_4_;
        fVar161 = auVar88._12_4_;
        fVar164 = ((1.0 - auVar141._0_4_ * fVar113) * fVar113 + fVar113) * auVar126._0_4_;
        fVar165 = ((1.0 - auVar141._4_4_ * fVar93) * fVar93 + fVar93) * auVar126._4_4_;
        fVar82 = ((1.0 - auVar141._8_4_ * fVar82) * fVar82 + fVar82) * auVar126._8_4_;
        fVar161 = ((1.0 - auVar141._12_4_ * fVar161) * fVar161 + fVar161) * auVar126._12_4_;
        fVar93 = *(float *)(ray + k * 4 + 0x80);
        fVar113 = *(float *)(ray + k * 4 + 0x30);
        auVar74._0_4_ = -(uint)(fVar164 <= fVar93 && fVar113 <= fVar164) & auVar153._0_4_;
        auVar74._4_4_ = -(uint)(fVar165 <= fVar93 && fVar113 <= fVar165) & auVar153._4_4_;
        auVar74._8_4_ = -(uint)(fVar82 <= fVar93 && fVar113 <= fVar82) & auVar153._8_4_;
        auVar74._12_4_ = -(uint)(fVar161 <= fVar93 && fVar113 <= fVar161) & auVar153._12_4_;
        iVar17 = movmskps(iVar17,auVar74);
        if (iVar17 != 0) {
          uVar16 = auVar74._0_4_ & -(uint)(auVar141._0_4_ != 0.0);
          uVar66 = auVar74._4_4_ & -(uint)(auVar141._4_4_ != 0.0);
          valid.field_0._0_8_ = CONCAT44(uVar66,uVar16);
          valid.field_0.i[2] = auVar74._8_4_ & -(uint)(auVar141._8_4_ != 0.0);
          valid.field_0.i[3] = auVar74._12_4_ & -(uint)(auVar141._12_4_ != 0.0);
          iVar17 = movmskps(iVar17,(undefined1  [16])valid.field_0);
          if (iVar17 != 0) {
            tNear.field_0.v[2] = fStack_1180;
            tNear.field_0._0_8_ = local_1188;
            tNear.field_0.v[3] = fStack_117c;
            auVar14._4_4_ = fStack_1174;
            auVar14._0_4_ = local_1178;
            auVar14._8_4_ = fStack_1170;
            auVar14._12_4_ = fStack_116c;
            local_11d8._4_4_ = fVar165;
            local_11d8._0_4_ = fVar164;
            fStack_11d0 = fVar82;
            fStack_11cc = fVar161;
            local_1198._8_8_ = uStack_1070;
            local_1198._0_8_ = local_1078;
            pSVar8 = context->scene;
            auVar88 = rcpps(auVar126,auVar14);
            fVar175 = auVar88._0_4_;
            fVar177 = auVar88._4_4_;
            fVar180 = auVar88._8_4_;
            fVar121 = auVar88._12_4_;
            fVar127 = (float)DAT_01f46a60;
            fVar128 = DAT_01f46a60._4_4_;
            fVar169 = DAT_01f46a60._12_4_;
            fVar113 = DAT_01f46a60._8_4_;
            fVar175 = (float)(-(uint)(1e-18 <= ABS(local_1178)) &
                             (uint)((fVar127 - local_1178 * fVar175) * fVar175 + fVar175));
            fVar177 = (float)(-(uint)(1e-18 <= ABS(fStack_1174)) &
                             (uint)((fVar128 - fStack_1174 * fVar177) * fVar177 + fVar177));
            fVar180 = (float)(-(uint)(1e-18 <= ABS(fStack_1170)) &
                             (uint)((fVar113 - fStack_1170 * fVar180) * fVar180 + fVar180));
            fVar121 = (float)(-(uint)(1e-18 <= ABS(fStack_116c)) &
                             (uint)((fVar169 - fStack_116c * fVar121) * fVar121 + fVar121));
            auVar154._0_4_ = fVar109 * fVar175;
            auVar154._4_4_ = fVar172 * fVar177;
            auVar154._8_4_ = fStack_1180 * fVar180;
            auVar154._12_4_ = fStack_117c * fVar121;
            auVar88 = minps(auVar154,_DAT_01f46a60);
            auVar185._0_4_ = fVar175 * (float)local_1168._0_4_;
            auVar185._4_4_ = fVar177 * (float)local_1168._4_4_;
            auVar185._8_4_ = fVar180 * fStack_1160;
            auVar185._12_4_ = fVar121 * fStack_115c;
            auVar150 = minps(auVar185,_DAT_01f46a60);
            auVar90._0_4_ = fVar127 - auVar88._0_4_;
            auVar90._4_4_ = fVar128 - auVar88._4_4_;
            auVar90._8_4_ = fVar113 - auVar88._8_4_;
            auVar90._12_4_ = fVar169 - auVar88._12_4_;
            auVar106._0_4_ = fVar127 - auVar150._0_4_;
            auVar106._4_4_ = fVar128 - auVar150._4_4_;
            auVar106._8_4_ = fVar113 - auVar150._8_4_;
            auVar106._12_4_ = fVar169 - auVar150._12_4_;
            local_11f8 = blendvps(auVar88,auVar90,local_1198);
            local_11e8 = blendvps(auVar150,auVar106,local_1198);
            auVar57._8_4_ = valid.field_0.i[2];
            auVar57._0_8_ = valid.field_0._0_8_;
            auVar57._12_4_ = valid.field_0.i[3];
            auVar12._4_4_ = fVar165;
            auVar12._0_4_ = fVar164;
            auVar12._8_4_ = fVar82;
            auVar12._12_4_ = fVar161;
            auVar150 = blendvps(_DAT_01f45a30,auVar12,auVar57);
            auVar107._4_4_ = auVar150._0_4_;
            auVar107._0_4_ = auVar150._4_4_;
            auVar107._8_4_ = auVar150._12_4_;
            auVar107._12_4_ = auVar150._8_4_;
            auVar88 = minps(auVar107,auVar150);
            auVar58._0_8_ = auVar88._8_8_;
            auVar58._8_4_ = auVar88._0_4_;
            auVar58._12_4_ = auVar88._4_4_;
            auVar88 = minps(auVar58,auVar88);
            auVar59._0_8_ =
                 CONCAT44(-(uint)(auVar88._4_4_ == auVar150._4_4_) & uVar66,
                          -(uint)(auVar88._0_4_ == auVar150._0_4_) & uVar16);
            auVar59._8_4_ = -(uint)(auVar88._8_4_ == auVar150._8_4_) & valid.field_0.i[2];
            auVar59._12_4_ = -(uint)(auVar88._12_4_ == auVar150._12_4_) & valid.field_0.i[3];
            iVar17 = movmskps(iVar17,auVar59);
            aVar75 = valid.field_0;
            if (iVar17 != 0) {
              aVar75.i[2] = auVar59._8_4_;
              aVar75._0_8_ = auVar59._0_8_;
              aVar75.i[3] = auVar59._12_4_;
            }
            uVar18 = movmskps(iVar17,(undefined1  [16])aVar75);
            lVar21 = 0;
            if (CONCAT44(uVar19,uVar18) != 0) {
              for (; (CONCAT44(uVar19,uVar18) >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
              }
            }
LAB_0070fbda:
            uVar16 = *(uint *)(lVar2 + 0xc0 + lVar21 * 4);
            pRVar22 = (RTCRayN *)(ulong)uVar16;
            pGVar9 = (pSVar8->geometries).items[(long)pRVar22].ptr;
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              valid.field_0.v[lVar21] = 0.0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar19 = *(undefined4 *)(local_11f8 + lVar21 * 4);
                uVar18 = *(undefined4 *)(local_11e8 + lVar21 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11d8 + lVar21 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_11c8 + lVar21 * 4);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_11b8 + lVar21 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_11a8 + lVar21 * 4);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar19;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar18;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)((long)&local_1278 + lVar21 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar16;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                goto LAB_007100b5;
              }
              local_10d8 = *(undefined4 *)(local_11f8 + lVar21 * 4);
              local_10c8 = *(undefined4 *)(local_11e8 + lVar21 * 4);
              uVar19 = *(undefined4 *)(local_11c8 + lVar21 * 4);
              uVar18 = *(undefined4 *)(local_11b8 + lVar21 * 4);
              local_10a8._4_4_ = uVar16;
              local_10a8._0_4_ = uVar16;
              local_10a8._8_4_ = uVar16;
              local_10a8._12_4_ = uVar16;
              uVar7 = *(undefined4 *)((long)&local_1278 + lVar21 * 4);
              local_10b8._4_4_ = uVar7;
              local_10b8._0_4_ = uVar7;
              local_10b8._8_4_ = uVar7;
              local_10b8._12_4_ = uVar7;
              local_1108._4_4_ = uVar19;
              local_1108._0_4_ = uVar19;
              local_1108._8_4_ = uVar19;
              local_1108._12_4_ = uVar19;
              local_10f8._4_4_ = uVar18;
              local_10f8._0_4_ = uVar18;
              local_10f8._8_4_ = uVar18;
              local_10f8._12_4_ = uVar18;
              local_10e8._4_4_ = *(undefined4 *)(local_11a8 + lVar21 * 4);
              local_10e8._0_4_ = local_10e8._4_4_;
              local_10e8._8_4_ = local_10e8._4_4_;
              local_10e8._12_4_ = local_10e8._4_4_;
              uStack_10d4 = local_10d8;
              uStack_10d0 = local_10d8;
              uStack_10cc = local_10d8;
              uStack_10c4 = local_10c8;
              uStack_10c0 = local_10c8;
              uStack_10bc = local_10c8;
              local_1098 = context->user->instID[0];
              uStack_1094 = local_1098;
              uStack_1090 = local_1098;
              uStack_108c = local_1098;
              local_1088 = context->user->instPrimID[0];
              uStack_1084 = local_1088;
              uStack_1080 = local_1088;
              uStack_107c = local_1088;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11d8 + lVar21 * 4);
              local_1318 = *(undefined1 (*) [16])
                            (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
              args.valid = (int *)local_1318;
              args.geometryUserPtr = pGVar9->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)local_1108;
              args.N = 4;
              pRVar22 = (RTCRayN *)pGVar9->intersectionFilterN;
              args.ray = (RTCRayN *)ray;
              if (pRVar22 != (RTCRayN *)0x0) {
                pRVar22 = (RTCRayN *)(*(code *)pRVar22)(&args);
              }
              if (local_1318 == (undefined1  [16])0x0) {
                auVar76._8_4_ = 0xffffffff;
                auVar76._0_8_ = 0xffffffffffffffff;
                auVar76._12_4_ = 0xffffffff;
                auVar76 = auVar76 ^ _DAT_01f46b70;
              }
              else {
                pRVar22 = (RTCRayN *)context->args->filter;
                if ((pRVar22 != (RTCRayN *)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))))
                {
                  pRVar22 = (RTCRayN *)(*(code *)pRVar22)(&args);
                }
                auVar60._0_4_ = -(uint)(local_1318._0_4_ == 0);
                auVar60._4_4_ = -(uint)(local_1318._4_4_ == 0);
                auVar60._8_4_ = -(uint)(local_1318._8_4_ == 0);
                auVar60._12_4_ = -(uint)(local_1318._12_4_ == 0);
                auVar76 = auVar60 ^ _DAT_01f46b70;
                if (local_1318 != (undefined1  [16])0x0) {
                  auVar88 = blendvps(*(undefined1 (*) [16])args.hit,
                                     *(undefined1 (*) [16])(args.ray + 0xc0),auVar60);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar88;
                  auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                     *(undefined1 (*) [16])(args.ray + 0xd0),auVar60);
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar88;
                  auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                     *(undefined1 (*) [16])(args.ray + 0xe0),auVar60);
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar88;
                  auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                     *(undefined1 (*) [16])(args.ray + 0xf0),auVar60);
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar88;
                  auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                     *(undefined1 (*) [16])(args.ray + 0x100),auVar60);
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar88;
                  auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                     *(undefined1 (*) [16])(args.ray + 0x110),auVar60);
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar88;
                  auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                     *(undefined1 (*) [16])(args.ray + 0x120),auVar60);
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar88;
                  auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                     *(undefined1 (*) [16])(args.ray + 0x130),auVar60);
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar88;
                  auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                     *(undefined1 (*) [16])(args.ray + 0x140),auVar60);
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar88;
                  pRVar22 = args.ray;
                }
              }
              if ((_DAT_01f46b40 & auVar76) == (undefined1  [16])0x0) {
                *(float *)(ray + k * 4 + 0x80) = fVar93;
              }
              else {
                fVar93 = *(float *)(ray + k * 4 + 0x80);
              }
              valid.field_0.v[lVar21] = 0.0;
              valid.field_0.i[0] = -(uint)(fVar164 <= fVar93) & valid.field_0.i[0];
              valid.field_0.i[1] = -(uint)(fVar165 <= fVar93) & valid.field_0.i[1];
              valid.field_0.i[2] = -(uint)(fVar82 <= fVar93) & valid.field_0.i[2];
              valid.field_0.i[3] = -(uint)(fVar161 <= fVar93) & valid.field_0.i[3];
            }
            iVar17 = movmskps((int)pRVar22,(undefined1  [16])valid.field_0);
            if (iVar17 == 0) goto LAB_007100b5;
            auVar13._4_4_ = fVar165;
            auVar13._0_4_ = fVar164;
            auVar13._8_4_ = fVar82;
            auVar13._12_4_ = fVar161;
            auVar150 = blendvps(_DAT_01f45a30,auVar13,(undefined1  [16])valid.field_0);
            auVar108._4_4_ = auVar150._0_4_;
            auVar108._0_4_ = auVar150._4_4_;
            auVar108._8_4_ = auVar150._12_4_;
            auVar108._12_4_ = auVar150._8_4_;
            auVar88 = minps(auVar108,auVar150);
            auVar77._0_8_ = auVar88._8_8_;
            auVar77._8_4_ = auVar88._0_4_;
            auVar77._12_4_ = auVar88._4_4_;
            auVar88 = minps(auVar77,auVar88);
            auVar78._0_8_ =
                 CONCAT44(-(uint)(auVar88._4_4_ == auVar150._4_4_) & valid.field_0._4_4_,
                          -(uint)(auVar88._0_4_ == auVar150._0_4_) & valid.field_0._0_4_);
            auVar78._8_4_ = -(uint)(auVar88._8_4_ == auVar150._8_4_) & valid.field_0._8_4_;
            auVar78._12_4_ = -(uint)(auVar88._12_4_ == auVar150._12_4_) & valid.field_0._12_4_;
            iVar17 = movmskps(iVar17,auVar78);
            aVar61 = valid.field_0;
            if (iVar17 != 0) {
              aVar61.i[2] = auVar78._8_4_;
              aVar61._0_8_ = auVar78._0_8_;
              aVar61.i[3] = auVar78._12_4_;
            }
            uVar19 = movmskps(iVar17,(undefined1  [16])aVar61);
            uVar23 = CONCAT44((int)((ulong)pRVar22 >> 0x20),uVar19);
            lVar21 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
              }
            }
            goto LAB_0070fbda;
          }
        }
      }
LAB_007100b5:
      auVar88 = local_1128;
      fVar164 = local_1028;
      fVar175 = fStack_1024;
      fVar177 = fStack_1020;
      fVar180 = fStack_101c;
      fVar165 = local_1038;
      fVar121 = fStack_1034;
      fVar127 = fStack_1030;
      fVar128 = fStack_102c;
      fVar129 = local_1118;
      fVar169 = fStack_1114;
      fVar171 = fStack_1110;
      fVar148 = fStack_110c;
      fVar113 = local_fe8;
      fVar157 = fStack_fe4;
      fVar159 = fStack_fe0;
      fVar31 = fStack_fdc;
      fVar93 = local_ff8;
      fVar62 = fStack_ff4;
      fVar63 = fStack_ff0;
      fVar64 = fStack_fec;
      fVar82 = local_1008;
      fVar65 = fStack_1004;
      fVar79 = fStack_1000;
      fVar81 = fStack_ffc;
      fVar161 = local_1018;
      fVar83 = fStack_1014;
      fVar91 = fStack_1010;
      fVar92 = fStack_100c;
      fVar172 = local_1048;
      fVar94 = fStack_1044;
      fVar95 = fStack_1040;
      fVar109 = fStack_103c;
      fVar183 = local_1058;
      fVar110 = fStack_1054;
      fVar111 = fStack_1050;
      fVar112 = fStack_104c;
    }
    uVar19 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar150._4_4_ = uVar19;
    auVar150._0_4_ = uVar19;
    auVar150._8_4_ = uVar19;
    auVar150._12_4_ = uVar19;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }